

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall ON_RTreeIterator::First(ON_RTreeIterator *this)

{
  ON_RTreeNode *pOVar1;
  bool bVar2;
  
  this->m_sp = (StackElement *)0x0;
  pOVar1 = this->m_root;
  if (((pOVar1 != (ON_RTreeNode *)0x0) && (-1 < pOVar1->m_level)) && (0 < pOVar1->m_count)) {
    this->m_stack[0].m_node = pOVar1;
    this->m_stack[0].m_branchIndex = 0;
    bVar2 = PushChildren(this,this->m_stack,true);
    return bVar2;
  }
  return false;
}

Assistant:

bool ON_RTreeIterator::First()
{ 
  m_sp = 0;
  if ( 0 == m_root || m_root->m_level < 0 || m_root->m_count <= 0 )
    return false;
  m_stack[0].m_node = m_root;
  m_stack[0].m_branchIndex = 0;
  return PushChildren(&m_stack[0],true);
}